

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  CURLsslset CVar1;
  undefined4 in_register_0000003c;
  
  curl_simple_lock_lock((atomic_int *)CONCAT44(in_register_0000003c,id));
  CVar1 = Curl_init_sslset_nolock(id,name,avail);
  s_lock = 0;
  return CVar1;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  CURLsslset rc;

  global_init_lock();

  rc = Curl_init_sslset_nolock(id, name, avail);

  global_init_unlock();

  return rc;
}